

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt64
          (OptionInterpreter *this,int number,uint64_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  LogMessage *pLVar1;
  LogMessage local_48;
  Voidify local_31;
  UnknownFieldSet *local_30;
  UnknownFieldSet *unknown_fields_local;
  uint64_t uStack_20;
  Type type_local;
  uint64_t value_local;
  OptionInterpreter *pOStack_10;
  int number_local;
  OptionInterpreter *this_local;
  
  local_30 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  uStack_20 = value;
  value_local._4_4_ = number;
  pOStack_10 = this;
  if (type == TYPE_UINT64) {
    UnknownFieldSet::AddVarint(unknown_fields,number,value);
  }
  else {
    if (type != TYPE_FIXED64) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x284c);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [39])"Invalid wire type for CPPTYPE_UINT64: ");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::
               operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                         (pLVar1,(Type *)((long)&unknown_fields_local + 4));
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    UnknownFieldSet::AddFixed64(unknown_fields,number,value);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt64(
    int number, uint64_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT64:
      unknown_fields->AddVarint(number, value);
      break;

    case FieldDescriptor::TYPE_FIXED64:
      unknown_fields->AddFixed64(number, value);
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT64: " << type;
      break;
  }
}